

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall
SuffixTree::GeneralizedSuffixTree::CalculateNumLeavesNumLCA(GeneralizedSuffixTree *this,Node *node)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (node->edges)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if (*(int *)&p_Var1[4]._M_nxt == 0) {
      node->num_leaves = node->num_leaves + 1;
    }
    else {
      CalculateNumLeavesNumLCA(this,(Node *)p_Var1[2]._M_nxt);
      node->num_leaves = node->num_leaves + *(int *)&p_Var1[2]._M_nxt[4]._M_nxt;
      node->num_lca = node->num_lca + *(int *)((long)&p_Var1[2]._M_nxt[4]._M_nxt + 4);
    }
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::CalculateNumLeavesNumLCA (Node *node)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
        {
            CalculateNumLeavesNumLCA (edge_pair.second.node);
            node->num_leaves += edge_pair.second.node->num_leaves;
            node->num_lca += edge_pair.second.node->num_lca;
        }
        else
            ++node->num_leaves;
}